

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalCommonGenerator.cxx
# Opt level: O2

string * __thiscall
cmLocalCommonGenerator::GetTargetFortranFlags
          (string *__return_storage_ptr__,cmLocalCommonGenerator *this,cmGeneratorTarget *target,
          string *config)

{
  cmMakefile *pcVar1;
  size_type sVar2;
  int iVar3;
  string *psVar4;
  undefined4 extraout_var;
  cmValue a;
  _Alloc_hider _Var5;
  string_view source;
  string_view source_00;
  string incflag;
  string modflag;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  includes;
  string mod_dir;
  allocator<char> local_c1;
  string *local_c0;
  string local_b8;
  string local_98;
  string local_78;
  string local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  pcVar1 = (this->super_cmLocalGenerator).Makefile;
  local_c0 = __return_storage_ptr__;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"CMAKE_Fortran_MODOUT_FLAG",(allocator<char> *)&local_98);
  psVar4 = cmMakefile::GetSafeDefinition(pcVar1,&local_50);
  (*(this->super_cmLocalGenerator).super_cmOutputConverter._vptr_cmOutputConverter[7])
            (this,local_c0,psVar4);
  std::__cxx11::string::~string((string *)&local_50);
  iVar3 = (*(this->super_cmLocalGenerator).super_cmOutputConverter._vptr_cmOutputConverter[0x16])
                    (this);
  cmGeneratorTarget::GetFortranModuleDirectory
            (&local_50,target,(string *)CONCAT44(extraout_var,iVar3));
  if (local_50._M_string_length == 0) {
    pcVar1 = (this->super_cmLocalGenerator).Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_98,"CMAKE_Fortran_MODDIR_DEFAULT",(allocator<char> *)&local_b8);
    cmMakefile::GetSafeDefinition(pcVar1,&local_98);
    std::__cxx11::string::_M_assign((string *)&local_50);
    psVar4 = &local_98;
  }
  else {
    (*(this->super_cmLocalGenerator).super_cmOutputConverter._vptr_cmOutputConverter[2])
              (&local_b8,this,&local_50);
    source._M_str = local_b8._M_dataplus._M_p;
    source._M_len = local_b8._M_string_length;
    cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
              (&local_98,(cmOutputConverter *)this,source,SHELL,false);
    std::__cxx11::string::operator=((string *)&local_50,(string *)&local_98);
    std::__cxx11::string::~string((string *)&local_98);
    psVar4 = &local_b8;
  }
  std::__cxx11::string::~string((string *)psVar4);
  if (local_50._M_string_length != 0) {
    pcVar1 = (this->super_cmLocalGenerator).Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b8,"CMAKE_Fortran_MODDIR_FLAG",(allocator<char> *)&local_78);
    psVar4 = cmMakefile::GetRequiredDefinition(pcVar1,&local_b8);
    cmStrCat<std::__cxx11::string_const&,std::__cxx11::string&>(&local_98,psVar4,&local_50);
    std::__cxx11::string::~string((string *)&local_b8);
    (*(this->super_cmLocalGenerator).super_cmOutputConverter._vptr_cmOutputConverter[7])
              (this,local_c0,&local_98);
    pcVar1 = (this->super_cmLocalGenerator).Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_78,"CMAKE_Fortran_MODDIR_INCLUDE_FLAG",&local_c1);
    psVar4 = cmMakefile::GetSafeDefinition(pcVar1,&local_78);
    std::__cxx11::string::string((string *)&local_b8,(string *)psVar4);
    std::__cxx11::string::~string((string *)&local_78);
    if (local_b8._M_string_length != 0) {
      cmStrCat<std::__cxx11::string&,std::__cxx11::string&>(&local_78,&local_b8,&local_50);
      std::__cxx11::string::operator=((string *)&local_b8,(string *)&local_78);
      std::__cxx11::string::~string((string *)&local_78);
      (*(this->super_cmLocalGenerator).super_cmOutputConverter._vptr_cmOutputConverter[7])
                (this,local_c0,&local_b8);
    }
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_98);
  }
  pcVar1 = (this->super_cmLocalGenerator).Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"CMAKE_Fortran_MODPATH_FLAG",(allocator<char> *)&local_b8);
  a = cmMakefile::GetDefinition(pcVar1,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  if (a.Value != (string *)0x0) {
    local_78._M_dataplus._M_p = (pointer)0x0;
    local_78._M_string_length = 0;
    local_78.field_2._M_allocated_capacity = 0;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_98,"C",(allocator<char> *)&local_b8);
    cmLocalGenerator::GetIncludeDirectories
              (&this->super_cmLocalGenerator,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_78,target,&local_98,config);
    std::__cxx11::string::~string((string *)&local_98);
    sVar2 = local_78._M_string_length;
    for (_Var5._M_p = local_78._M_dataplus._M_p; _Var5._M_p != (pointer)sVar2;
        _Var5._M_p = _Var5._M_p + 0x20) {
      source_00._M_str = *(char **)_Var5._M_p;
      source_00._M_len = *(size_t *)(_Var5._M_p + 8);
      cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
                (&local_b8,(cmOutputConverter *)this,source_00,SHELL,false);
      cmStrCat<std::__cxx11::string_const&,std::__cxx11::string>(&local_98,a.Value,&local_b8);
      std::__cxx11::string::~string((string *)&local_b8);
      (*(this->super_cmLocalGenerator).super_cmOutputConverter._vptr_cmOutputConverter[7])
                (this,local_c0,&local_98);
      std::__cxx11::string::~string((string *)&local_98);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_78);
  }
  std::__cxx11::string::~string((string *)&local_50);
  return local_c0;
}

Assistant:

std::string cmLocalCommonGenerator::GetTargetFortranFlags(
  cmGeneratorTarget const* target, std::string const& config)
{
  std::string flags;

  // Enable module output if necessary.
  this->AppendFlags(
    flags, this->Makefile->GetSafeDefinition("CMAKE_Fortran_MODOUT_FLAG"));

  // Add a module output directory flag if necessary.
  std::string mod_dir =
    target->GetFortranModuleDirectory(this->GetWorkingDirectory());
  if (!mod_dir.empty()) {
    mod_dir = this->ConvertToOutputFormat(
      this->MaybeRelativeToWorkDir(mod_dir), cmOutputConverter::SHELL);
  } else {
    mod_dir =
      this->Makefile->GetSafeDefinition("CMAKE_Fortran_MODDIR_DEFAULT");
  }
  if (!mod_dir.empty()) {
    std::string modflag = cmStrCat(
      this->Makefile->GetRequiredDefinition("CMAKE_Fortran_MODDIR_FLAG"),
      mod_dir);
    this->AppendFlags(flags, modflag);
    // Some compilers do not search their own module output directory
    // for using other modules.  Add an include directory explicitly
    // for consistency with compilers that do search it.
    std::string incflag =
      this->Makefile->GetSafeDefinition("CMAKE_Fortran_MODDIR_INCLUDE_FLAG");
    if (!incflag.empty()) {
      incflag = cmStrCat(incflag, mod_dir);
      this->AppendFlags(flags, incflag);
    }
  }

  // If there is a separate module path flag then duplicate the
  // include path with it.  This compiler does not search the include
  // path for modules.
  if (cmValue modpath_flag =
        this->Makefile->GetDefinition("CMAKE_Fortran_MODPATH_FLAG")) {
    std::vector<std::string> includes;
    this->GetIncludeDirectories(includes, target, "C", config);
    for (std::string const& id : includes) {
      std::string flg =
        cmStrCat(*modpath_flag,
                 this->ConvertToOutputFormat(id, cmOutputConverter::SHELL));
      this->AppendFlags(flags, flg);
    }
  }

  return flags;
}